

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::openWebSocket
          (ConcurrencyLimitingHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode OVar2;
  void *pvVar3;
  int __flags;
  StringPtr *params;
  void *__child_stack;
  ConcurrencyLimitingHttpClient *this_00;
  __fn *in_R8;
  __fn *__arg;
  SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6537:15)>
  *location_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6537:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  promise;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  String urlCopy;
  HttpHeaders headersCopy;
  ConnectionCounter counter;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  HttpClient local_188;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_180;
  code *local_178;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  local_170;
  Array<char> local_158;
  OwnPromiseNode local_140;
  undefined *local_138;
  undefined *puStack_130;
  undefined8 local_128;
  size_t local_120;
  HttpHeaders *local_118;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_110;
  HttpHeaders local_108;
  anon_class_128_3_d8bda789_for_func local_a8;
  
  local_120 = url.content.size_;
  this_00 = (ConcurrencyLimitingHttpClient *)url.content.ptr;
  local_118 = headers;
  local_a8.this = this_00;
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    this_00->concurrentRequests = this_00->concurrentRequests + 1;
    (*this_00->inner->_vptr_HttpClient[1])(&local_108);
    fireCountChanged(this_00);
    attachCounter(this,(Promise<kj::HttpClient::WebSocketResponse> *)&local_108,
                  (ConnectionCounter *)&local_a8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_a8);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffe60;
    location.fileName = (char *)in_stack_fffffffffffffe58;
    location._16_8_ = in_stack_fffffffffffffe68;
    __arg = in_R8;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (&local_170,location);
    __flags = (int)headers;
    str<kj::StringPtr&>((String *)&local_158,(kj *)&local_120,params);
    HttpHeaders::clone(&local_108,in_R8,__child_stack,__flags,__arg);
    local_a8.urlCopy.content.ptr = local_158.ptr;
    local_a8.urlCopy.content.size_ = local_158.size_;
    local_a8.urlCopy.content.disposer = local_158.disposer;
    local_158.ptr = (char *)0x0;
    local_158.size_ = 0;
    HttpHeaders::HttpHeaders(&local_a8.headersCopy,&local_108);
    local_178 = kj::_::
                SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6537:15)>
                ::anon_class_128_3_d8bda789_for_func::operator();
    pPVar1 = *(PromiseArena **)((long)local_170.promise.super_PromiseBase.node.ptr + 8);
    if (pPVar1 == (PromiseArena *)0x0 ||
        (ulong)((long)local_170.promise.super_PromiseBase.node.ptr - (long)pPVar1) < 0xa0) {
      pvVar3 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6537:15)>
                     *)((long)pvVar3 + 0x360);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,&local_a8
                 ,&local_178);
      *(void **)((long)pvVar3 + 0x368) = pvVar3;
    }
    else {
      *(PromiseArena **)((long)local_170.promise.super_PromiseBase.node.ptr + 8) =
           (PromiseArena *)0x0;
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6537:15)>
                     *)((long)local_170.promise.super_PromiseBase.node.ptr + -0xa0);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,&local_a8
                 ,&local_178);
      *(PromiseArena **)((long)local_170.promise.super_PromiseBase.node.ptr + -0x98) = pPVar1;
    }
    local_138 = &DAT_003d3151;
    puStack_130 = &DAT_003d31b0;
    local_128 = 0x4c0000058b;
    location_00.function = &DAT_003d31b0;
    location_00.fileName = &DAT_003d3151;
    location_00.lineNumber = 0x58b;
    location_00.columnNumber = 0x4c;
    local_180.ptr = (PromiseNode *)location_01;
    kj::_::maybeChain<kj::HttpClient::WebSocketResponse>
              (&local_140,(Promise<kj::HttpClient::WebSocketResponse> *)&local_180,location_00);
    OVar2.ptr = local_140.ptr;
    local_140.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
    local_188._vptr_HttpClient = (_func_int **)OVar2.ptr;
    local_110.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_110);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_a8);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,&local_170.fulfiller);
    fireCountChanged(this_00);
    (this->super_HttpClient)._vptr_HttpClient = local_188._vptr_HttpClient;
    local_188._vptr_HttpClient = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_188);
    HttpHeaders::~HttpHeaders(&local_108);
    Array<char>::~Array(&local_158);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair(&local_170);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const kj::HttpHeaders& headers) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.openWebSocket(url, headers);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto promise = paf.promise
        .then([this,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy)](ConnectionCounter&& counter) mutable {
      return attachCounter(inner.openWebSocket(urlCopy, headersCopy), kj::mv(counter));
    });

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return kj::mv(promise);
  }